

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variable.cpp
# Opt level: O2

void __thiscall Variable::Variable(Variable *this,string *variable_name,variable_type var_type)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  this->type = var_type;
  return;
}

Assistant:

Variable::Variable(const string& variable_name, variable_type var_type)
{
	this->name = variable_name;
	this->type = var_type;
}